

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O3

bool __thiscall embree::TokenStream::trySymbols(TokenStream *this,Token *token,ParseLocation *loc)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  pointer pbVar5;
  ulong uVar6;
  long lVar7;
  string local_90;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  char local_58 [16];
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  ssize_t local_38;
  ssize_t sStack_30;
  
  pbVar5 = (this->symbols).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->symbols).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      bVar4 = trySymbol(this,(string *)((long)&(pbVar5->_M_dataplus)._M_p + lVar7));
      if (bVar4) {
        pbVar5 = (this->symbols).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar1 = *(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar7);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,lVar1,
                   *(long *)((long)&pbVar5->_M_string_length + lVar7) + lVar1);
        Token::Token((Token *)local_70,&local_90,TY_SYMBOL,loc);
        token->ty = local_70._0_4_;
        token->field_1 = (anon_union_4_3_4e90a026_for_Token_2)local_70._4_4_;
        std::__cxx11::string::operator=((string *)&token->str,(string *)&local_68);
        _Var3._M_pi = _Stack_40._M_pi;
        peVar2 = local_48;
        local_48 = (element_type *)0x0;
        _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (token->loc).fileName.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        (token->loc).fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = peVar2;
        (token->loc).fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = _Var3._M_pi;
        if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          (token->loc).lineNumber = local_38;
          (token->loc).colNumber = sStack_30;
        }
        else {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          (token->loc).lineNumber = local_38;
          (token->loc).colNumber = sStack_30;
          if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
          }
        }
        if (local_68._M_p != local_58) {
          operator_delete(local_68._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        return true;
      }
      uVar6 = uVar6 + 1;
      pbVar5 = (this->symbols).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x20;
    } while (uVar6 < (ulong)((long)(this->symbols).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5));
  }
  return false;
}

Assistant:

bool TokenStream::trySymbols(Token& token, const ParseLocation& loc)
  {
    for (size_t i=0; i<symbols.size(); i++) {
      if (!trySymbol(symbols[i])) continue;
      token = Token(symbols[i],Token::TY_SYMBOL,loc);
      return true;
    }
    return false;
  }